

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_ori_16_toc(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint addr_in;
  
  uVar5 = m68ki_cpu.c_flag;
  uVar4 = m68ki_cpu.v_flag;
  uVar3 = m68ki_cpu.not_z_flag;
  uVar2 = m68ki_cpu.n_flag;
  uVar1 = m68ki_cpu.x_flag;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  addr_in = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  uVar6 = m68k_read_memory_16(addr_in & m68ki_cpu.address_mask);
  uVar6 = uVar6 & 0xff |
          uVar5 >> 8 & 1 |
          uVar4 >> 6 & 2 | (uVar2 >> 4 & 8 | uVar1 >> 4 & 0x10) + (uint)(uVar3 == 0) * 4;
  m68ki_cpu.x_flag = uVar6 << 4 & 0x100;
  m68ki_cpu.n_flag = uVar6 << 4 & 0x80;
  m68ki_cpu.not_z_flag = (uint)((uVar6 & 4) == 0);
  m68ki_cpu.v_flag = (uVar6 & 2) << 6;
  m68ki_cpu.c_flag = (uVar6 & 1) << 8;
  return;
}

Assistant:

static void m68k_op_ori_16_toc(void)
{
	m68ki_set_ccr(m68ki_get_ccr() | OPER_I_8());
}